

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O0

uint16_t __thiscall World::first_empty_game_string_id(World *this,uint16_t initial_index)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  ulong local_28;
  size_t i;
  uint16_t initial_index_local;
  World *this_local;
  
  local_28 = (ulong)initial_index;
  while( true ) {
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&this->_game_strings);
    if (sVar2 <= local_28) {
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->_game_strings);
      return (uint16_t)sVar2;
    }
    this_00 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&this->_game_strings,local_28);
    bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                      (this_00);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return (uint16_t)local_28;
}

Assistant:

uint16_t World::first_empty_game_string_id(uint16_t initial_index) const
{
    for(size_t i=initial_index ; i<_game_strings.size() ; ++i)
        if(_game_strings[i].empty())
            return (uint16_t) i;
    return _game_strings.size();
}